

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O2

void __thiscall SQVM::FindOuter(SQVM *this,SQObjectPtr *target,SQObjectPtr *stackindex)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  SQUnsignedInteger SVar3;
  SQObjectValue *pSVar4;
  SQObjectPtr local_30;
  
  pSVar4 = (SQObjectValue *)&this->_openouters;
  while ((local_30.super_SQObject._unVal.pOuter = (SQOuter *)pSVar4->pTable,
         (SQOuter *)local_30.super_SQObject._unVal.pTable != (SQOuter *)0x0 &&
         (pSVar2 = ((local_30.super_SQObject._unVal.pTable)->super_SQDelegable)._delegate,
         stackindex <= pSVar2))) {
    if (pSVar2 == (SQTable *)stackindex) {
      local_30.super_SQObject._type = OT_OUTER;
      pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQObjectPtr::operator=(target,&local_30);
      goto LAB_0012b391;
    }
    pSVar4 = (SQObjectValue *)&(local_30.super_SQObject._unVal.pOuter)->_next;
  }
  local_30.super_SQObject._unVal.pOuter = SQOuter::Create(this->_sharedstate,stackindex);
  (local_30.super_SQObject._unVal.pOuter)->_next = (SQOuter *)*(SQOuter **)pSVar4;
  (local_30.super_SQObject._unVal.pOuter)->_idx = (long)stackindex - (long)(this->_stack)._vals >> 4
  ;
  SVar3 = (local_30.super_SQObject._unVal.pRefCounted)->_uiRef;
  pSVar4->pOuter = (SQOuter *)local_30.super_SQObject._unVal;
  local_30.super_SQObject._type = OT_OUTER;
  ((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
  super_SQRefCounted._uiRef = SVar3 + 2;
  SQObjectPtr::operator=(target,&local_30);
LAB_0012b391:
  SQObjectPtr::~SQObjectPtr(&local_30);
  return;
}

Assistant:

void SQVM::FindOuter(SQObjectPtr &target, SQObjectPtr *stackindex)
{
    SQOuter **pp = &_openouters;
    SQOuter *p;
    SQOuter *otr;

    while ((p = *pp) != NULL && p->_valptr >= stackindex) {
        if (p->_valptr == stackindex) {
            target = SQObjectPtr(p);
            return;
        }
        pp = &p->_next;
    }
    otr = SQOuter::Create(_ss(this), stackindex);
    otr->_next = *pp;
    otr->_idx  = (stackindex - _stack._vals);
    __ObjAddRef(otr);
    *pp = otr;
    target = SQObjectPtr(otr);
}